

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioSourceVoice_FlushSourceBuffers(FAudioSourceVoice *voice)

{
  FAudioBufferEntry *pFVar1;
  FAudioBufferEntry *pFVar2;
  FAudioBufferEntry **ppFVar3;
  FAudioBufferEntry *pFVar4;
  
  FAudio_PlatformLockMutex((voice->field_19).src.bufferLock);
  pFVar1 = (voice->field_19).src.bufferList;
  if ((pFVar1 == (FAudioBufferEntry *)0x0 || (voice->field_19).src.active != '\x01') ||
     ((voice->field_19).src.newBuffer != '\0')) {
    (voice->field_19).src.curBufferOffset = 0;
    (voice->field_19).src.bufferList = (FAudioBufferEntry *)0x0;
    (voice->field_19).src.newBuffer = '\0';
    pFVar2 = pFVar1;
  }
  else {
    pFVar2 = pFVar1->next;
    pFVar1->next = (FAudioBufferEntry *)0x0;
  }
  if (pFVar2 != (FAudioBufferEntry *)0x0) {
    pFVar1 = (voice->field_19).src.flushList;
    if (pFVar1 == (FAudioBufferEntry *)0x0) {
      ppFVar3 = &(voice->field_19).src.flushList;
    }
    else {
      do {
        pFVar4 = pFVar1;
        pFVar1 = pFVar4->next;
      } while (pFVar1 != (FAudioBufferEntry *)0x0);
      ppFVar3 = &pFVar4->next;
    }
    *ppFVar3 = pFVar2;
  }
  FAudio_PlatformUnlockMutex((voice->field_19).src.bufferLock);
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_FlushSourceBuffers(
	FAudioSourceVoice *voice
) {
	FAudioBufferEntry *entry, *latest;

	LOG_API_ENTER(voice->audio)
	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)

	/* If the source is playing, don't flush the active buffer */
	entry = voice->src.bufferList;
	if ((voice->src.active == 1) && entry != NULL && !voice->src.newBuffer)
	{
		entry = entry->next;
		voice->src.bufferList->next = NULL;
	}
	else
	{
		voice->src.curBufferOffset = 0;
		voice->src.bufferList = NULL;
		voice->src.newBuffer = 0;
	}

	/* Move them to the pending flush list */
	if (entry != NULL)
	{
		if (voice->src.flushList == NULL)
		{
			voice->src.flushList = entry;
		}
		else
		{
			latest = voice->src.flushList;
			while (latest->next != NULL)
			{
				latest = latest->next;
			}
			latest->next = entry;
		}
	}

	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}